

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainstate.h
# Opt level: O0

bool CreateAndActivateUTXOSnapshot<__25_const>(Level param_1,byte param_2)

{
  ConstevalFormatString<2U> fmt;
  string_view source_file;
  string_view logging_function;
  undefined1 uVar1;
  byte bVar2;
  int iVar3;
  Chainstate *this;
  Chainstate *this_00;
  CBlockIndex *pCVar4;
  CBlockIndex *pCVar5;
  runtime_error *this_01;
  long in_FS_OFFSET;
  bool bVar6;
  CBlockIndex *tip;
  Chainstate *new_active;
  CBlockIndex *pindex;
  Chainstate *chain;
  CBlockIndex *orig_tip;
  FILE *infile;
  FILE *outfile;
  NodeContext *node;
  int height;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock10;
  AutoFile auto_infile;
  AutoFile auto_outfile;
  Result<CBlockIndex_*> res;
  BlockValidationState state;
  uint256 gen_hash;
  SnapshotMetadata metadata;
  UniValue result;
  path snapshot_path;
  path root;
  undefined4 in_stack_fffffffffffffa48;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffa4c;
  path *in_stack_fffffffffffffa50;
  char *obj;
  ChainstateManager *in_stack_fffffffffffffa58;
  ChainstateManager *this_02;
  path *in_stack_fffffffffffffa60;
  CBlockIndex *this_03;
  undefined4 in_stack_fffffffffffffa68;
  int in_stack_fffffffffffffa6c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa70;
  undefined4 in_stack_fffffffffffffa78;
  int in_stack_fffffffffffffa7c;
  SnapshotMetadata *in_stack_fffffffffffffa80;
  undefined4 in_stack_fffffffffffffa88;
  MessageStartChars in_stack_fffffffffffffa8c;
  Chainstate *in_stack_fffffffffffffa90;
  undefined7 in_stack_fffffffffffffaa8;
  undefined1 in_stack_fffffffffffffaaf;
  path *in_stack_fffffffffffffab0;
  undefined4 in_stack_fffffffffffffab8;
  int in_stack_fffffffffffffabc;
  Chainstate *in_stack_fffffffffffffac0;
  CBlockIndex *pCVar8;
  undefined6 in_stack_fffffffffffffac8;
  undefined1 in_stack_ffffffffffffface;
  undefined1 in_stack_fffffffffffffacf;
  undefined7 in_stack_fffffffffffffaf8;
  undefined1 in_stack_fffffffffffffaff;
  size_t in_stack_fffffffffffffb00;
  char *in_stack_fffffffffffffb08;
  size_t in_stack_fffffffffffffb10;
  char *in_stack_fffffffffffffb18;
  CBlockIndex *local_460;
  undefined7 in_stack_fffffffffffffc00;
  undefined1 in_stack_fffffffffffffc07;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc08;
  shared_ptr<const_CBlock> *in_stack_fffffffffffffc10;
  undefined7 in_stack_fffffffffffffc20;
  undefined1 in_stack_fffffffffffffc47;
  SnapshotMetadata *in_stack_fffffffffffffc48;
  AutoFile *in_stack_fffffffffffffc50;
  ChainstateManager *in_stack_fffffffffffffc58;
  string local_270 [272];
  undefined1 local_160 [64];
  undefined1 local_120 [200];
  char local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  fs::path::path((path *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),
                 (path *)0xcde558);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
  CreateAndActivateUTXOSnapshot<const_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/chainstate.h:19:27)>
  ::anon_class_16_2_4a69ea14::operator()
            ((anon_class_16_2_4a69ea14 *)
             CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
  fs::path::path((path *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),
                 (path *)0xcde5aa);
  tinyformat::format<int>
            ((char *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
             (int *)in_stack_fffffffffffffa70);
  fs::u8path((string *)in_stack_fffffffffffffa80);
  fs::operator/(in_stack_fffffffffffffa60,(path *)in_stack_fffffffffffffa58);
  fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
  fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
  fsbridge::fopen(local_58,"wb");
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)
             CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
  AutoFile::AutoFile((AutoFile *)in_stack_fffffffffffffa90,
                     (FILE *)CONCAT44(in_stack_fffffffffffffa8c._M_elems,in_stack_fffffffffffffa88),
                     (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffa80);
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffa58);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
  ChainstateManager::ActiveChainstate(in_stack_fffffffffffffa58);
  CreateUTXOSnapshot((NodeContext *)
                     CONCAT17(in_stack_fffffffffffffacf,
                              CONCAT16(in_stack_ffffffffffffface,in_stack_fffffffffffffac8)),
                     in_stack_fffffffffffffac0,
                     (AutoFile *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                     in_stack_fffffffffffffab0,
                     (path *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
             (char *)in_stack_fffffffffffffa60);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
             (char *)in_stack_fffffffffffffa60);
  fs::path::make_preferred((path *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
  fs::PathToString_abi_cxx11_(in_stack_fffffffffffffa50);
  UniValue::write_abi_cxx11_((UniValue *)local_160,(int)local_120,(void *)0x0,0);
  this_03 = (CBlockIndex *)local_160;
  this_02 = (ChainstateManager *)(local_160 + 0x20);
  obj = "Wrote UTXO snapshot to %s: %s\n";
  uVar7 = 2;
  logging_function._M_str = in_stack_fffffffffffffb18;
  logging_function._M_len = in_stack_fffffffffffffb10;
  source_file._M_str = in_stack_fffffffffffffb08;
  source_file._M_len = in_stack_fffffffffffffb00;
  fmt.fmt._7_1_ = in_stack_fffffffffffffaff;
  fmt.fmt._0_7_ = in_stack_fffffffffffffaf8;
  LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
            (logging_function,source_file,in_stack_fffffffffffffabc,
             (LogFlags)in_stack_fffffffffffffab0,param_1,fmt,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),in_stack_fffffffffffffc08
            );
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffa4c,uVar7));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffa4c,uVar7));
  fsbridge::fopen(local_58,"rb");
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)
             CONCAT44(in_stack_fffffffffffffa4c,uVar7));
  AutoFile::AutoFile((AutoFile *)in_stack_fffffffffffffa90,
                     (FILE *)CONCAT44(in_stack_fffffffffffffa8c._M_elems,in_stack_fffffffffffffa88),
                     (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffa80);
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)this_02);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             CONCAT44(in_stack_fffffffffffffa4c,uVar7));
  ChainstateManager::GetParams((ChainstateManager *)CONCAT44(in_stack_fffffffffffffa4c,uVar7));
  CChainParams::MessageStart((CChainParams *)CONCAT44(in_stack_fffffffffffffa4c,uVar7));
  ::node::SnapshotMetadata::SnapshotMetadata(in_stack_fffffffffffffa80,in_stack_fffffffffffffa8c);
  AutoFile::operator>>((AutoFile *)this_02,(SnapshotMetadata *)obj);
  anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)this_02,(AutoFile *)obj,
             (SnapshotMetadata *)CONCAT44(in_stack_fffffffffffffa4c,uVar7));
  if ((param_2 & 1) != 0) {
    MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
              ((AnnotatedMixin<std::recursive_mutex> *)CONCAT44(in_stack_fffffffffffffa4c,uVar7));
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
               CONCAT44(in_stack_fffffffffffffa8c._M_elems,in_stack_fffffffffffffa88),
               (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffa80,
               (char *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
               (char *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa6c,
               SUB41((uint)in_stack_fffffffffffffa68 >> 0x18,0));
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               CONCAT44(in_stack_fffffffffffffa4c,uVar7));
    ChainstateManager::ActiveChainstate(this_02);
    local_460 = CChain::Tip((CChain *)this_02);
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               CONCAT44(in_stack_fffffffffffffa4c,uVar7));
    ChainstateManager::ActiveChainstate(this_02);
    this = (Chainstate *)CChain::operator[]((CChain *)this_03,(int)((ulong)this_02 >> 0x20));
    CBlockIndex::GetBlockHash((CBlockIndex *)this_02);
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               CONCAT44(in_stack_fffffffffffffa4c,uVar7));
    ChainstateManager::ResetChainstates(this_02);
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               CONCAT44(in_stack_fffffffffffffa4c,uVar7));
    std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::get
              ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)
               CONCAT44(in_stack_fffffffffffffa4c,uVar7));
    ChainstateManager::InitializeChainstate
              (this_02,(CTxMemPool *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               CONCAT44(in_stack_fffffffffffffa4c,uVar7));
    this_00 = ChainstateManager::ActiveChainstate(this_02);
    uVar1 = Chainstate::LoadGenesisBlock(this);
    inline_assertion_check<true,bool>
              ((bool *)CONCAT44(in_stack_fffffffffffffa8c._M_elems,in_stack_fffffffffffffa88),
               (char *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa7c,
               (char *)in_stack_fffffffffffffa70,
               (char *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
    fs::path::path((path *)0xcdeb22,(char *)CONCAT44(in_stack_fffffffffffffa4c,uVar7));
    Chainstate::InitCoinsDB
              (in_stack_fffffffffffffa90,
               CONCAT44(in_stack_fffffffffffffa8c._M_elems,in_stack_fffffffffffffa88),
               SUB81((ulong)in_stack_fffffffffffffa80 >> 0x38,0),
               SUB81((ulong)in_stack_fffffffffffffa80 >> 0x30,0),
               (path *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
    fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffa4c,uVar7));
    Chainstate::InitCoinsCache((Chainstate *)this_02,(size_t)obj);
    Chainstate::CoinsTip
              ((Chainstate *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
    CCoinsViewCache::SetBestBlock
              ((CCoinsViewCache *)CONCAT44(in_stack_fffffffffffffa4c,uVar7),(uint256 *)0xcdeb94);
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               CONCAT44(in_stack_fffffffffffffa4c,uVar7));
    pCVar4 = ::node::BlockManager::LookupBlockIndex
                       ((BlockManager *)
                        CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                        (uint256 *)this_03);
    std::set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>::insert
              ((set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
                *)this_02,(value_type *)obj);
    Chainstate::LoadChainTip(this_00);
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               CONCAT44(in_stack_fffffffffffffa4c,uVar7));
    ChainstateManager::MaybeRebalanceCaches
              ((ChainstateManager *)
               CONCAT44(in_stack_fffffffffffffa8c._M_elems,in_stack_fffffffffffffa88));
    while( true ) {
      bVar6 = false;
      if (local_460 != (CBlockIndex *)0x0) {
        pCVar8 = local_460;
        pCVar5 = CChain::Tip((CChain *)this_02);
        bVar6 = pCVar8 != pCVar5;
      }
      if (!bVar6) break;
      bVar6 = CBlockIndex::IsValid(this_03,(BlockStatus)((ulong)this_02 >> 0x20));
      if (!bVar6) {
        __assert_fail("pindex->IsValid(BlockStatus::BLOCK_VALID_TREE)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/chainstate.h"
                      ,99,
                      "bool CreateAndActivateUTXOSnapshot(TestingSetup *, F, bool, bool) [F = const (lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/chainstate.h:19:27)]"
                     );
      }
      local_460->nStatus = 2;
      local_460->nTx = 0;
      local_460->m_chain_tx_count = 0;
      local_460->nSequenceId = 0;
      local_460 = local_460->pprev;
    }
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
               CONCAT44(in_stack_fffffffffffffa4c,uVar7));
    BlockValidationState::BlockValidationState
              ((BlockValidationState *)CONCAT44(in_stack_fffffffffffffa4c,uVar7));
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               CONCAT44(in_stack_fffffffffffffa4c,uVar7));
    ChainstateManager::ActiveChainstate(this_02);
    std::shared_ptr<const_CBlock>::shared_ptr
              ((shared_ptr<const_CBlock> *)CONCAT44(in_stack_fffffffffffffa4c,uVar7),
               (nullptr_t)0xcdefc4);
    bVar6 = Chainstate::ActivateBestChain
                      ((Chainstate *)CONCAT17(uVar1,in_stack_fffffffffffffc20),
                       (BlockValidationState *)pCVar4,in_stack_fffffffffffffc10);
    std::shared_ptr<const_CBlock>::~shared_ptr
              ((shared_ptr<const_CBlock> *)CONCAT44(in_stack_fffffffffffffa4c,uVar7));
    if (((bVar6 ^ 0xffU) & 1) != 0) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                ((ValidationState<BlockValidationResult> *)
                 CONCAT44(in_stack_fffffffffffffa8c._M_elems,in_stack_fffffffffffffa88));
      tinyformat::format<std::__cxx11::string>
                ((char *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                 in_stack_fffffffffffffa70);
      std::runtime_error::runtime_error(this_01,local_270);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00cdf423;
    }
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               CONCAT44(in_stack_fffffffffffffa4c,uVar7));
    ChainstateManager::GetMutex((ChainstateManager *)CONCAT44(in_stack_fffffffffffffa4c,uVar7));
    MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
              ((AnnotatedMixin<std::recursive_mutex> *)CONCAT44(in_stack_fffffffffffffa4c,uVar7));
    iVar3 = CreateAndActivateUTXOSnapshot<const_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/chainstate.h:19:27)>
            ::anon_class_8_1_898f5b00::operator()
                      ((anon_class_8_1_898f5b00 *)
                       CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
    inline_assertion_check<true,bool>
              ((bool *)CONCAT44(iVar3,in_stack_fffffffffffffa88),(char *)in_stack_fffffffffffffa80,
               in_stack_fffffffffffffa7c,(char *)in_stack_fffffffffffffa70,
               (char *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
    BlockValidationState::~BlockValidationState
              ((BlockValidationState *)CONCAT44(in_stack_fffffffffffffa4c,uVar7));
  }
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             CONCAT44(in_stack_fffffffffffffa4c,uVar7));
  ChainstateManager::ActiveChainstate(this_02);
  pCVar4 = CChain::Tip((CChain *)this_02);
  if (pCVar4->pprev != (CBlockIndex *)0x0) {
    CChain::SetTip((CChain *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),this_03);
  }
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             CONCAT44(in_stack_fffffffffffffa4c,uVar7));
  ChainstateManager::ActivateSnapshot
            (in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
             (bool)in_stack_fffffffffffffc47);
  CChain::SetTip((CChain *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),this_03);
  bVar2 = util::Result::operator_cast_to_bool
                    ((Result<CBlockIndex_*> *)CONCAT44(in_stack_fffffffffffffa4c,uVar7));
  util::Result<CBlockIndex_*>::~Result
            ((Result<CBlockIndex_*> *)CONCAT44(in_stack_fffffffffffffa4c,uVar7));
  ::node::SnapshotMetadata::~SnapshotMetadata
            ((SnapshotMetadata *)CONCAT44(in_stack_fffffffffffffa4c,uVar7));
  AutoFile::~AutoFile((AutoFile *)CONCAT44(in_stack_fffffffffffffa4c,uVar7));
  UniValue::~UniValue((UniValue *)CONCAT44(in_stack_fffffffffffffa4c,uVar7));
  AutoFile::~AutoFile((AutoFile *)CONCAT44(in_stack_fffffffffffffa4c,uVar7));
  fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffa4c,uVar7));
  fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffa4c,uVar7));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar2 & 1);
  }
LAB_00cdf423:
  __stack_chk_fail();
}

Assistant:

static bool
CreateAndActivateUTXOSnapshot(
    TestingSetup* fixture,
    F malleation = NoMalleation,
    bool reset_chainstate = false,
    bool in_memory_chainstate = false)
{
    node::NodeContext& node = fixture->m_node;
    fs::path root = fixture->m_path_root;

    // Write out a snapshot to the test's tempdir.
    //
    int height;
    WITH_LOCK(::cs_main, height = node.chainman->ActiveHeight());
    fs::path snapshot_path = root / fs::u8path(tfm::format("test_snapshot.%d.dat", height));
    FILE* outfile{fsbridge::fopen(snapshot_path, "wb")};
    AutoFile auto_outfile{outfile};

    UniValue result = CreateUTXOSnapshot(
        node, node.chainman->ActiveChainstate(), auto_outfile, snapshot_path, snapshot_path);
    LogPrintf(
        "Wrote UTXO snapshot to %s: %s\n", fs::PathToString(snapshot_path.make_preferred()), result.write());

    // Read the written snapshot in and then activate it.
    //
    FILE* infile{fsbridge::fopen(snapshot_path, "rb")};
    AutoFile auto_infile{infile};
    node::SnapshotMetadata metadata{node.chainman->GetParams().MessageStart()};
    auto_infile >> metadata;

    malleation(auto_infile, metadata);

    if (reset_chainstate) {
        {
            // What follows is code to selectively reset chainstate data without
            // disturbing the existing BlockManager instance, which is needed to
            // recognize the headers chain previously generated by the chainstate we're
            // removing. Without those headers, we can't activate the snapshot below.
            //
            // This is a stripped-down version of node::LoadChainstate which
            // preserves the block index.
            LOCK(::cs_main);
            CBlockIndex *orig_tip = node.chainman->ActiveChainstate().m_chain.Tip();
            uint256 gen_hash = node.chainman->ActiveChainstate().m_chain[0]->GetBlockHash();
            node.chainman->ResetChainstates();
            node.chainman->InitializeChainstate(node.mempool.get());
            Chainstate& chain = node.chainman->ActiveChainstate();
            Assert(chain.LoadGenesisBlock());
            // These cache values will be corrected shortly in `MaybeRebalanceCaches`.
            chain.InitCoinsDB(1 << 20, true, false, "");
            chain.InitCoinsCache(1 << 20);
            chain.CoinsTip().SetBestBlock(gen_hash);
            chain.setBlockIndexCandidates.insert(node.chainman->m_blockman.LookupBlockIndex(gen_hash));
            chain.LoadChainTip();
            node.chainman->MaybeRebalanceCaches();

            // Reset the HAVE_DATA flags below the snapshot height, simulating
            // never-having-downloaded them in the first place.
            // TODO: perhaps we could improve this by using pruning to delete
            // these blocks instead
            CBlockIndex *pindex = orig_tip;
            while (pindex && pindex != chain.m_chain.Tip()) {
                // Remove all data and validity flags by just setting
                // BLOCK_VALID_TREE. Also reset transaction counts and sequence
                // ids that are set when blocks are received, to make test setup
                // more realistic and satisfy consistency checks in
                // CheckBlockIndex().
                assert(pindex->IsValid(BlockStatus::BLOCK_VALID_TREE));
                pindex->nStatus = BlockStatus::BLOCK_VALID_TREE;
                pindex->nTx = 0;
                pindex->m_chain_tx_count = 0;
                pindex->nSequenceId = 0;
                pindex = pindex->pprev;
            }
        }
        BlockValidationState state;
        if (!node.chainman->ActiveChainstate().ActivateBestChain(state)) {
            throw std::runtime_error(strprintf("ActivateBestChain failed. (%s)", state.ToString()));
        }
        Assert(
            0 == WITH_LOCK(node.chainman->GetMutex(), return node.chainman->ActiveHeight()));
    }

    auto& new_active = node.chainman->ActiveChainstate();
    auto* tip = new_active.m_chain.Tip();

    // Disconnect a block so that the snapshot chainstate will be ahead, otherwise
    // it will refuse to activate.
    //
    // TODO this is a unittest-specific hack, and we should probably rethink how to
    // better generate/activate snapshots in unittests.
    if (tip->pprev) {
        new_active.m_chain.SetTip(*(tip->pprev));
    }

    auto res = node.chainman->ActivateSnapshot(auto_infile, metadata, in_memory_chainstate);

    // Restore the old tip.
    new_active.m_chain.SetTip(*tip);
    return !!res;
}